

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

bool __thiscall
TiXmlPrinter::VisitEnter(TiXmlPrinter *this,TiXmlElement *element,TiXmlAttribute *firstAttribute)

{
  bool bVar1;
  int iVar2;
  char *suffix;
  TiXmlNode *pTVar3;
  undefined4 extraout_var;
  TiXmlNode *pTVar4;
  undefined4 extraout_var_00;
  TiXmlAttribute *local_28;
  TiXmlAttribute *attrib;
  TiXmlAttribute *firstAttribute_local;
  TiXmlElement *element_local;
  TiXmlPrinter *this_local;
  
  DoIndent(this);
  TiXmlString::operator+=(&this->buffer,"<");
  suffix = TiXmlNode::Value(&element->super_TiXmlNode);
  TiXmlString::operator+=(&this->buffer,suffix);
  for (local_28 = firstAttribute; local_28 != (TiXmlAttribute *)0x0;
      local_28 = TiXmlAttribute::Next(local_28)) {
    TiXmlString::operator+=(&this->buffer," ");
    TiXmlAttribute::Print(local_28,(FILE *)0x0,0,&this->buffer);
  }
  pTVar3 = TiXmlNode::FirstChild(&element->super_TiXmlNode);
  if (pTVar3 == (TiXmlNode *)0x0) {
    TiXmlString::operator+=(&this->buffer," />");
    DoLineBreak(this);
  }
  else {
    TiXmlString::operator+=(&this->buffer,">");
    pTVar3 = TiXmlNode::FirstChild(&element->super_TiXmlNode);
    iVar2 = (*(pTVar3->super_TiXmlBase)._vptr_TiXmlBase[8])();
    if (CONCAT44(extraout_var,iVar2) != 0) {
      pTVar3 = TiXmlNode::LastChild(&element->super_TiXmlNode);
      pTVar4 = TiXmlNode::FirstChild(&element->super_TiXmlNode);
      if (pTVar3 == pTVar4) {
        pTVar3 = TiXmlNode::FirstChild(&element->super_TiXmlNode);
        iVar2 = (*(pTVar3->super_TiXmlBase)._vptr_TiXmlBase[8])();
        bVar1 = TiXmlText::CDATA((TiXmlText *)CONCAT44(extraout_var_00,iVar2));
        if (!bVar1) {
          this->simpleTextPrint = true;
          goto LAB_00119ddf;
        }
      }
    }
    DoLineBreak(this);
  }
LAB_00119ddf:
  this->depth = this->depth + 1;
  return true;
}

Assistant:

bool TiXmlPrinter::VisitEnter( const TiXmlElement& element, const TiXmlAttribute* firstAttribute )
{
	DoIndent();
	buffer += "<";
	buffer += element.Value();

	for( const TiXmlAttribute* attrib = firstAttribute; attrib; attrib = attrib->Next() )
	{
		buffer += " ";
		attrib->Print( 0, 0, &buffer );
	}

	if ( !element.FirstChild() ) 
	{
		buffer += " />";
		DoLineBreak();
	}
	else 
	{
		buffer += ">";
		if (    element.FirstChild()->ToText()
			  && element.LastChild() == element.FirstChild()
			  && element.FirstChild()->ToText()->CDATA() == false )
		{
			simpleTextPrint = true;
			// no DoLineBreak()!
		}
		else
		{
			DoLineBreak();
		}
	}
	++depth;	
	return true;
}